

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O0

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* __thiscall LongReadsRecruiter::all_paths_fw(LongReadsRecruiter *this,sgNodeID_t node)

{
  bool bVar1;
  LongReadsRecruiter *in_RDX;
  vector<long,_std::allocator<long>_> *in_RSI;
  LongReadsRecruiter *__n;
  vector<int,_std::allocator<int>_> *in_RDI;
  int rid;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> rids;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *r;
  vector<int,_std::allocator<int>_> *this_00;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff60;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  const_reference local_60;
  sgNodeID_t in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  byte bVar3;
  
  uVar2 = 0;
  this_00 = in_RDI;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)0x4ddce5);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                0x4ddcef);
  __n = in_RDX;
  if ((long)in_RDX < 1) {
    __n = (LongReadsRecruiter *)-(long)in_RDX;
  }
  local_60 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RSI + 5),(size_type)__n);
  local_68._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)this_00,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_68);
    path_fw(in_RDX,CONCAT17(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    std::
    vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
    ::emplace_back<std::vector<long,std::allocator<long>>>
              ((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)in_stack_ffffffffffffff60,in_RSI);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_ffffffffffffff60);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)this_00);
    bVar1 = std::vector<long,_std::allocator<long>_>::empty(in_stack_ffffffffffffff60);
    if (bVar1) {
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::pop_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)0x4dddc7);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_68);
  }
  bVar3 = 1;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x4dde16);
  if ((bVar3 & 1) == 0) {
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)in_stack_ffffffffffffff60);
  }
  return (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *)this_00;
}

Assistant:

std::vector<std::vector<sgNodeID_t> > LongReadsRecruiter::all_paths_fw(sgNodeID_t node) const {
    std::vector<std::vector<sgNodeID_t> > r;
    std::unordered_set<seqID_t> rids;
    for (auto rid:node_paths[llabs(node)] ){
        if (node<0) rid=-rid;
        r.emplace_back(path_fw(rid,node));
        if (r.back().empty()) r.pop_back();

    }
    return r;
}